

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_EvalThis(JSContext *ctx,JSValue this_obj,char *input,size_t input_len,char *filename,
                   int eval_flags)

{
  int in_EDX;
  int64_t in_R8;
  JSValueUnion in_R9;
  JSValue JVar1;
  undefined4 in_stack_00000008;
  int eval_type;
  JSValue ret;
  char *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0 [16];
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffe8;
  
  JVar1.tag = in_R8;
  JVar1.u.float64 = in_R9.float64;
  JVar1 = JS_EvalInternal((JSContext *)
                          (CONCAT44(in_stack_00000008,in_stack_ffffffffffffffb0) & 0x3ffffffff),
                          JVar1,in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._0_8_,
                          in_stack_ffffffffffffff98,in_EDX,in_stack_ffffffffffffffe8);
  return JVar1;
}

Assistant:

JSValue JS_EvalThis(JSContext *ctx, JSValueConst this_obj,
                    const char *input, size_t input_len,
                    const char *filename, int eval_flags)
{
    int eval_type = eval_flags & JS_EVAL_TYPE_MASK;
    JSValue ret;

    assert(eval_type == JS_EVAL_TYPE_GLOBAL ||
           eval_type == JS_EVAL_TYPE_MODULE);
    ret = JS_EvalInternal(ctx, this_obj, input, input_len, filename,
                          eval_flags, -1);
    return ret;
}